

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O3

uint __thiscall BTree<NodeBTree,_NodeKey>::searchByKey(BTree<NodeBTree,_NodeKey> *this,NodeKey *key)

{
  byte bVar1;
  uint *puVar2;
  byte *pbVar3;
  uint8_t *data;
  long lVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  KeyCompareOp in_R9;
  uint count;
  SearchResult result;
  SearchResult local_50;
  code *local_40;
  undefined8 uStack_38;
  
  puVar2 = (uint *)this->m_data;
  uVar8 = *puVar2;
  count = (uint)(byte)*puVar2;
  local_50.lowerBound = 0;
  local_50.upperBound = 0;
  local_50.index = 0xffffffff;
  local_50.maxIndex = 0;
  pbVar6 = (byte *)((long)puVar2 +
                   (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8));
  if ((byte)*puVar2 != 0) {
    uVar8 = count;
    do {
      local_40 = NodeBTree::lessThanKeyCompareOp;
      uStack_38 = 0;
      pbVar6 = searchWithComparison(this,&local_50,pbVar6,count,key,in_R9);
      if (pbVar6 == (byte *)0x0) {
        data = (uint8_t *)0x0;
        goto LAB_0011ddcc;
      }
      uVar9 = (ulong)*pbVar6;
      pbVar3 = pbVar6 + 1;
      if ((char)*pbVar6 < '\0') {
        uVar7 = 0x80;
        do {
          bVar1 = *pbVar3;
          lVar4 = uVar9 - uVar7;
          pbVar3 = pbVar3 + 1;
          uVar7 = uVar7 << 7;
          uVar5 = lVar4 * 0x100;
          uVar9 = bVar1 | uVar5;
        } while ((uVar5 & uVar7) != 0);
      }
      local_50.maxIndex = (uint)uVar9;
      uVar9 = (ulong)*pbVar3;
      if ((char)*pbVar3 < '\0') {
        uVar7 = 0x80;
        do {
          pbVar3 = pbVar3 + 1;
          lVar4 = uVar9 - uVar7;
          uVar7 = uVar7 << 7;
          uVar5 = lVar4 * 0x100;
          uVar9 = *pbVar3 | uVar5;
        } while ((uVar5 & uVar7) != 0);
      }
      pbVar6 = this->m_data + (uVar9 & 0xffffffff);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  local_40 = NodeBTree::equalKeyCompareOp;
  uStack_38 = 0;
  data = searchWithComparison(this,&local_50,pbVar6,0,key,in_R9);
LAB_0011ddcc:
  if (count == 0) {
    local_50._0_8_ = local_50._0_8_ & 0xffffffff;
  }
  if (data == (uint8_t *)0x0) {
    uVar8 = 0xffffffff;
  }
  else {
    uVar8 = (local_50.maxIndex - local_50.upperBound) + local_50.lowerBound;
    NodeBTree::parseData((NodeBTree *)this,key,data);
  }
  return uVar8;
}

Assistant:

unsigned int searchByKey(Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);
		
		const auto count = static_cast<unsigned int>(readAtWithByteSwap<uint8_t>(m_data, 0));
		const auto offset = readAtWithByteSwap<uint32_t>(m_data, 0) & UINT32_C(0xFFFFFF);
		
		auto data = advancePointer(m_data, offset);
		SearchResult result;
		for (auto i = count; i != 0; i--) {
			data = searchWithComparison(result, data, count, key, &Derived::lessThanKeyCompareOp);
			if (!data)
				goto done;
			
			result.maxIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			
			data = self.advanceData(data);
			
			const auto nextOffset = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			data = advancePointer(m_data, nextOffset);
		}
		
		data = searchWithComparison(result, data, 0, key, &Derived::equalKeyCompareOp);

	done:
		if (count == 0)
			result.upperBound = 0;
			
		if (data) {
			const auto index = (result.maxIndex - result.upperBound + result.lowerBound);
			self.parseData(key, data);
			return index;
		} else {
			return INVALID_INDEX;
		}
	}